

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jas_stream.c
# Opt level: O0

long jas_stream_tell(jas_stream_t *stream)

{
  int iVar1;
  long lVar2;
  int local_1c;
  int offset;
  int adjust;
  jas_stream_t *stream_local;
  
  iVar1 = jas_getdbglevel();
  if (99 < iVar1) {
    jas_eprintf("jas_stream_tell(%p)\n",stream);
  }
  if ((stream->bufmode_ & 0x10U) == 0) {
    if ((stream->bufmode_ & 0x20U) == 0) {
      local_1c = 0;
    }
    else {
      local_1c = (int)stream->ptr_ - (int)stream->bufstart_;
    }
  }
  else {
    local_1c = -stream->cnt_;
  }
  lVar2 = (*stream->ops_->seek_)(stream->obj_,0,1);
  if ((int)lVar2 < 0) {
    stream_local = (jas_stream_t *)0xffffffffffffffff;
  }
  else {
    stream_local = (jas_stream_t *)(long)((int)lVar2 + local_1c);
  }
  return (long)stream_local;
}

Assistant:

long jas_stream_tell(jas_stream_t *stream)
{
	int adjust;
	int offset;

	JAS_DBGLOG(100, ("jas_stream_tell(%p)\n", stream));

	if (stream->bufmode_ & JAS_STREAM_RDBUF) {
		adjust = -stream->cnt_;
	} else if (stream->bufmode_ & JAS_STREAM_WRBUF) {
		adjust = stream->ptr_ - stream->bufstart_;
	} else {
		adjust = 0;
	}

	if ((offset = (*stream->ops_->seek_)(stream->obj_, 0, SEEK_CUR)) < 0) {
		return -1;
	}

	return offset + adjust;
}